

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Scaler * __thiscall CoreML::Specification::Model::mutable_scaler(Model *this)

{
  Scaler *this_00;
  
  if (this->_oneof_case_[0] == 0x25c) {
    this_00 = (Scaler *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x25c;
    this_00 = (Scaler *)operator_new(0x40);
    Scaler::Scaler(this_00);
    (this->Type_).scaler_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Scaler* Model::mutable_scaler() {
  if (!has_scaler()) {
    clear_Type();
    set_has_scaler();
    Type_.scaler_ = new ::CoreML::Specification::Scaler;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.scaler)
  return Type_.scaler_;
}